

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fault_injection_test.cc
# Opt level: O0

void __thiscall
leveldb::FaultInjectionTest::NoWriteTestReopenWithFault
          (FaultInjectionTest *this,ResetMethod reset_method)

{
  undefined1 local_1c0 [428];
  ResetMethod local_14;
  FaultInjectionTest *pFStack_10;
  ResetMethod reset_method_local;
  FaultInjectionTest *this_local;
  
  local_14 = reset_method;
  pFStack_10 = this;
  CloseDB(this);
  ResetDBState(this,local_14);
  test::Tester::Tester
            ((Tester *)(local_1c0 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/fault_injection_test.cc"
             ,0x1fe);
  OpenDB((FaultInjectionTest *)local_1c0);
  test::Tester::IsOk((Tester *)(local_1c0 + 8),(Status *)local_1c0);
  Status::~Status((Status *)local_1c0);
  test::Tester::~Tester((Tester *)(local_1c0 + 8));
  return;
}

Assistant:

void NoWriteTestReopenWithFault(ResetMethod reset_method) {
    CloseDB();
    ResetDBState(reset_method);
    ASSERT_OK(OpenDB());
  }